

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

string * kaitai::kstream::bytes_to_str(string *__return_storage_ptr__,string *src,string *src_enc)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  runtime_error *prVar4;
  size_t sVar5;
  size_t dst_used;
  size_t res;
  char *dst_ptr;
  char *src_ptr;
  size_t dst_left;
  char *local_50;
  size_t dst_len;
  size_t src_left;
  size_t src_len;
  iconv_t local_28;
  iconv_t cd;
  string *src_enc_local;
  string *src_local;
  string *dst;
  
  cd = src_enc;
  src_enc_local = src;
  src_local = __return_storage_ptr__;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_28 = iconv_open("UTF-8",pcVar2);
  if (local_28 != (iconv_t)0xffffffffffffffff) {
    dst_len = std::__cxx11::string::length();
    pcVar2 = (char *)(dst_len * 2);
    dst_left._7_1_ = 0;
    local_50 = pcVar2;
    src_left = dst_len;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(ulong)pcVar2,' ',(allocator *)((long)&dst_left + 6)
              );
    std::allocator<char>::~allocator((allocator<char> *)((long)&dst_left + 6));
    src_ptr = local_50;
    dst_ptr = (char *)std::__cxx11::string::operator[]((ulong)src);
    res = std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    while( true ) {
      sVar5 = iconv(local_28,&dst_ptr,&dst_len,(char **)&res,(size_t *)&src_ptr);
      if (sVar5 != 0xffffffffffffffff) {
        std::__cxx11::string::resize((ulong)__return_storage_ptr__);
        iVar1 = iconv_close(local_28);
        if (iVar1 == 0) {
          return __return_storage_ptr__;
        }
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"iconv close error");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      piVar3 = __errno_location();
      if (*piVar3 != 7) break;
      src_ptr = src_ptr + (long)local_50;
      local_50 = (char *)((long)local_50 * 2);
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      res = std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"iconv error");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0x16) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"error opening iconv");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"invalid encoding pair conversion requested");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string kaitai::kstream::bytes_to_str(std::string src, std::string src_enc) {
    iconv_t cd = iconv_open(KS_STR_DEFAULT_ENCODING, src_enc.c_str());

    if (cd == (iconv_t) -1) {
        if (errno == EINVAL) {
            throw std::runtime_error("invalid encoding pair conversion requested");
        } else {
            throw std::runtime_error("error opening iconv");
        }
    }

    size_t src_len = src.length();
    size_t src_left = src_len;

    // Start with a buffer length of double the source length.
    size_t dst_len = src_len * 2;
    std::string dst(dst_len, ' ');
    size_t dst_left = dst_len;

    char *src_ptr = &src[0];
    char *dst_ptr = &dst[0];

    while (true) {
        size_t res = iconv(cd, &src_ptr, &src_left, &dst_ptr, &dst_left);

        if (res == (size_t) -1) {
            if (errno == E2BIG) {
                // dst buffer is not enough to accomodate whole string
                // enlarge the buffer and try again
                size_t dst_used = dst_len - dst_left;
                dst_left += dst_len;
                dst_len += dst_len;
                dst.resize(dst_len);

                // dst.resize might have allocated destination buffer in another area
                // of memory, thus our previous pointer "dst" will be invalid; re-point
                // it using "dst_used".
                dst_ptr = &dst[dst_used];
            } else {
                throw std::runtime_error("iconv error");
            }
        } else {
            // conversion successful
            dst.resize(dst_len - dst_left);
            break;
        }
    }

    if (iconv_close(cd) != 0)
        throw std::runtime_error("iconv close error");

    return dst;
}